

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int saveCursorKey(BtCursor *pCur)

{
  uchar *puVar1;
  u8 uVar2;
  long lVar3;
  int iVar4;
  uchar *pBuf;
  int iVar5;
  ulong uVar6;
  
  uVar2 = pCur->curIntKey;
  getCellInfo(pCur);
  if (uVar2 == '\0') {
    uVar6 = (ulong)(pCur->info).nPayload;
    pCur->nKey = uVar6;
    pBuf = (uchar *)sqlite3Malloc(uVar6 + 0x11);
    if (pBuf == (uchar *)0x0) {
      iVar5 = 7;
    }
    else {
      iVar5 = 0;
      iVar4 = accessPayload(pCur,0,(u32)pCur->nKey,pBuf,0);
      if (iVar4 == 0) {
        lVar3 = pCur->nKey;
        puVar1 = pBuf + lVar3;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        pBuf[lVar3 + 0x10] = '\0';
        pCur->pKey = pBuf;
      }
      else {
        sqlite3_free(pBuf);
        iVar5 = iVar4;
      }
    }
  }
  else {
    pCur->nKey = (pCur->info).nKey;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int saveCursorKey(BtCursor *pCur){
  int rc = SQLITE_OK;
  assert( CURSOR_VALID==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curIntKey ){
    /* Only the rowid is required for a table btree */
    pCur->nKey = sqlite3BtreeIntegerKey(pCur);
  }else{
    /* For an index btree, save the complete key content. It is possible
    ** that the current key is corrupt. In that case, it is possible that
    ** the sqlite3VdbeRecordUnpack() function may overread the buffer by
    ** up to the size of 1 varint plus 1 8-byte value when the cursor 
    ** position is restored. Hence the 17 bytes of padding allocated 
    ** below. */
    void *pKey;
    pCur->nKey = sqlite3BtreePayloadSize(pCur);
    pKey = sqlite3Malloc( pCur->nKey + 9 + 8 );
    if( pKey ){
      rc = sqlite3BtreePayload(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        memset(((u8*)pKey)+pCur->nKey, 0, 9+8);
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  assert( !pCur->curIntKey || !pCur->pKey );
  return rc;
}